

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int is_uppercase(char *str)

{
  size_t sVar1;
  ushort **ppuVar2;
  int local_24;
  ulong uStack_20;
  int hasupper;
  size_t c;
  char *str_local;
  
  local_24 = 0;
  if ((str == (char *)0x0) || (*str == '\0')) {
    str_local._4_4_ = 0;
  }
  else {
    for (uStack_20 = 0; sVar1 = strlen(str), uStack_20 < sVar1; uStack_20 = uStack_20 + 1) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)str[uStack_20]] & 0x200) != 0) {
        return 0;
      }
      if ((local_24 == 0) &&
         (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)str[uStack_20]] & 0x100) != 0)) {
        local_24 = 1;
      }
    }
    str_local._4_4_ = local_24;
  }
  return str_local._4_4_;
}

Assistant:

static int is_uppercase(const char * str)
{
   size_t c;
   int hasupper = 0;

   if( !str || !*str ) return 0;

   for(c = 0; c < strlen(str); c++ ) {
     if( islower((int) str[c]) ) return 0;
     if( !hasupper && isupper((int) str[c]) ) hasupper = 1;
   }

   return hasupper;
}